

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription_sync_test.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::price::pixie::subscription_sync_test::SubscriptionSyncTest_test_summarize_Test::
~SubscriptionSyncTest_test_summarize_Test(SubscriptionSyncTest_test_summarize_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SubscriptionSyncTest, test_summarize)
{
    SubscriptionSync subscription_sync = SubscriptionSync(EDITION, subject_list);
    ASSERT_EQ("SubscriptionSync(edition=123, compressed=false, controls=0, changed=true, subjects=2)",
                 subscription_sync.Summarize());

    subscription_sync.AddControl(0, ControlOperationEnum::TOGGLE);
    subscription_sync.AddControl(1, ControlOperationEnum::REFRESH);
    ASSERT_EQ("SubscriptionSync(edition=123, compressed=false, controls=2, changed=true, subjects=2)",
                 subscription_sync.Summarize());

    subscription_sync.SetCompressed(true);
    ASSERT_EQ("SubscriptionSync(edition=123, compressed=true, controls=2, changed=true, subjects=2)",
                 subscription_sync.Summarize());
}